

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall
cmCTestLaunch::LoadScrapeRules
          (cmCTestLaunch *this,char *purpose,
          vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps)

{
  bool bVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string line;
  string fname;
  ifstream fin;
  RegularExpression rex;
  string local_4a0;
  string local_480;
  istream local_460;
  RegularExpression local_258;
  
  local_258.regmatch.startp[1] = (this->Reporter).LogDir._M_dataplus._M_p;
  local_258.regmatch.startp[0] = (char *)(this->Reporter).LogDir._M_string_length;
  local_258.regmatch.startp[2] = (char *)0x0;
  local_258.regmatch.startp[3] = (char *)0x6;
  local_258.regmatch.startp[4] = "Custom";
  local_258.regmatch.startp[5] = (char *)0x0;
  local_258.regmatch.startp[6] = (char *)strlen(purpose);
  local_258.regmatch.startp[8] = (char *)0x0;
  local_258.regmatch.startp[9] = (char *)0x4;
  local_258.regmatch.startp[10] = ".txt";
  local_258.regmatch.startp[0xb] = (char *)0x0;
  views._M_len = 4;
  views._M_array = (iterator)&local_258;
  local_258.regmatch.startp[7] = purpose;
  cmCatViews(&local_480,views);
  std::ifstream::ifstream(&local_460,local_480._M_dataplus._M_p,_S_in|_S_bin);
  local_4a0._M_string_length = 0;
  local_4a0.field_2._M_local_buf[0] = '\0';
  local_258.regmust = (char *)0x0;
  local_258.program = (char *)0x0;
  local_258.progsize = 0;
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  memset(&local_258,0,0x20a);
  while( true ) {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      (&local_460,&local_4a0,(bool *)0x0,0xffffffffffffffff);
    if (!bVar1) break;
    bVar1 = cmsys::RegularExpression::compile(&local_258,local_4a0._M_dataplus._M_p);
    if (bVar1) {
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                (regexps,&local_258);
    }
  }
  if (local_258.program != (char *)0x0) {
    operator_delete__(local_258.program);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,
                    CONCAT71(local_4a0.field_2._M_allocated_capacity._1_7_,
                             local_4a0.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(&local_460);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestLaunch::LoadScrapeRules(
  const char* purpose, std::vector<cmsys::RegularExpression>& regexps) const
{
  std::string fname =
    cmStrCat(this->Reporter.LogDir, "Custom", purpose, ".txt");
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  cmsys::RegularExpression rex;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (rex.compile(line)) {
      regexps.push_back(rex);
    }
  }
}